

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrsIntersect.cpp
# Opt level: O3

bool GeoCalcs::CrsIntersect
               (LLPoint *llPt1,double az13,LLPoint *llPt2,double az23,double dTol,
               LLPoint *llIntersect)

{
  bool bVar1;
  double dist23;
  double dist13;
  double local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_20 = 0.0;
  local_10 = 0.0;
  bVar1 = CrsIntersect(llPt1,az13,&local_8,&local_10,llPt2,az23,&local_18,&local_20,dTol,llIntersect
                      );
  return bVar1;
}

Assistant:

bool CrsIntersect(const LLPoint &llPt1, double az13,
                      const LLPoint &llPt2, double az23, double dTol, LLPoint &llIntersect)
    {
        double az31, dist13, az32, dist23;
        az31 = az32 = 0.0;
        dist13 = dist23 = 0.0;
        return CrsIntersect(llPt1, az13, az31, dist13,
                            llPt2, az23, az32, dist23,
                            dTol, llIntersect);

    }